

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SectionStats::~SectionStats(SectionStats *this)

{
  void *in_RDI;
  
  ~SectionStats((SectionStats *)0x1ae2e8);
  operator_delete(in_RDI,0x98);
  return;
}

Assistant:

SectionStats::~SectionStats() {}